

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O2

void __thiscall OpenMD::DataStorage::resize(DataStorage *this,size_t newSize)

{
  uint uVar1;
  
  uVar1 = this->storageLayout_;
  if ((uVar1 & 1) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->position,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 2) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->velocity,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 4) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->force,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 8) != 0) {
    internalResize<OpenMD::SquareMatrix3<double>>(this,&this->aMat,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x10) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->angularMomentum,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x20) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->torque,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x40) != 0) {
    internalResize<double>(this,&this->particlePot,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((char)uVar1 < '\0') {
    internalResize<double>(this,&this->density,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    internalResize<double>(this,&this->functional,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    internalResize<double>(this,&this->functionalDerivative,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->dipole,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    internalResize<OpenMD::SquareMatrix3<double>>(this,&this->quadrupole,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    internalResize<OpenMD::Vector3<double>>(this,&this->electricField,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    internalResize<double>(this,&this->skippedCharge,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    internalResize<double>(this,&this->flucQPos,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((short)uVar1 < 0) {
    internalResize<double>(this,&this->flucQVel,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    internalResize<double>(this,&this->flucQFrc,newSize);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    internalResize<double>(this,&this->sitePotential,newSize);
  }
  this->size_ = newSize;
  return;
}

Assistant:

void DataStorage::resize(std::size_t newSize) {
    if (storageLayout_ & dslPosition) { internalResize(position, newSize); }

    if (storageLayout_ & dslVelocity) { internalResize(velocity, newSize); }

    if (storageLayout_ & dslForce) { internalResize(force, newSize); }

    if (storageLayout_ & dslAmat) { internalResize(aMat, newSize); }

    if (storageLayout_ & dslAngularMomentum) {
      internalResize(angularMomentum, newSize);
    }

    if (storageLayout_ & dslTorque) { internalResize(torque, newSize); }

    if (storageLayout_ & dslParticlePot) {
      internalResize(particlePot, newSize);
    }

    if (storageLayout_ & dslDensity) { internalResize(density, newSize); }

    if (storageLayout_ & dslFunctional) { internalResize(functional, newSize); }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalResize(functionalDerivative, newSize);
    }

    if (storageLayout_ & dslDipole) { internalResize(dipole, newSize); }

    if (storageLayout_ & dslQuadrupole) { internalResize(quadrupole, newSize); }

    if (storageLayout_ & dslElectricField) {
      internalResize(electricField, newSize);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalResize(skippedCharge, newSize);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalResize(flucQPos, newSize);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalResize(flucQVel, newSize);
    }

    if (storageLayout_ & dslFlucQForce) { internalResize(flucQFrc, newSize); }

    if (storageLayout_ & dslSitePotential) {
      internalResize(sitePotential, newSize);
    }

    size_ = newSize;
  }